

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseDragging(int button,float lock_threshold)

{
  ImGuiContext *g;
  float lock_threshold_local;
  int button_local;
  bool local_1;
  
  if (((GImGui->IO).MouseDown[button] & 1U) == 0) {
    local_1 = false;
  }
  else {
    lock_threshold_local = lock_threshold;
    if (lock_threshold < 0.0) {
      lock_threshold_local = (GImGui->IO).MouseDragThreshold;
    }
    local_1 = lock_threshold_local * lock_threshold_local <=
              (GImGui->IO).MouseDragMaxDistanceSqr[button];
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseDragging(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (!g.IO.MouseDown[button])
        return false;
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    return g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold;
}